

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * GenStateInstallNumLiteral(jx9_gen_state *pGen,sxu32 *pIdx)

{
  sxu32 local_2c;
  jx9_gen_state *pjStack_28;
  sxu32 nIdx;
  jx9_value *pObj;
  sxu32 *pIdx_local;
  jx9_gen_state *pGen_local;
  
  local_2c = 0;
  pObj = (jx9_value *)pIdx;
  pIdx_local = (sxu32 *)pGen;
  pjStack_28 = (jx9_gen_state *)jx9VmReserveConstObj(pGen->pVm,&local_2c);
  if (pjStack_28 == (jx9_gen_state *)0x0) {
    GenStateOutOfMem((jx9_gen_state *)pIdx_local);
    pGen_local = (jx9_gen_state *)0x0;
  }
  else {
    *(sxu32 *)&pObj->x = local_2c;
    pGen_local = pjStack_28;
  }
  return (jx9_value *)pGen_local;
}

Assistant:

static jx9_value * GenStateInstallNumLiteral(jx9_gen_state *pGen, sxu32 *pIdx)
{
	jx9_value *pObj;
	sxu32 nIdx = 0; /* cc warning */
	/* Reserve a new constant */
	pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pObj == 0 ){
		GenStateOutOfMem(pGen);
		return 0;
	}
	*pIdx = nIdx;
	/* TODO(chems): Create a numeric table (64bit int keys) same as 
	 * the constant string iterals table [optimization purposes].
	 */
	return pObj;
}